

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O3

size_t ZSTD_freeCCtx(ZSTD_CCtx *cctx)

{
  ZSTD_CCtx *pZVar1;
  
  if (cctx == (ZSTD_CCtx *)0x0) {
    return 0;
  }
  if (cctx->staticSize == 0) {
    if (cctx < (ZSTD_CCtx *)(cctx->workspace).workspace) {
      ZSTD_freeCCtxContent(cctx);
    }
    else {
      pZVar1 = (ZSTD_CCtx *)(cctx->workspace).workspaceEnd;
      ZSTD_freeCCtxContent(cctx);
      if (cctx <= pZVar1) {
        return 0;
      }
    }
    ZSTD_customFree(cctx,cctx->customMem);
    return 0;
  }
  return 0xffffffffffffffc0;
}

Assistant:

size_t ZSTD_freeCCtx(ZSTD_CCtx* cctx)
{
    if (cctx==NULL) return 0;   /* support free on NULL */
    RETURN_ERROR_IF(cctx->staticSize, memory_allocation,
                    "not compatible with static CCtx");
    {
        int cctxInWorkspace = ZSTD_cwksp_owns_buffer(&cctx->workspace, cctx);
        ZSTD_freeCCtxContent(cctx);
        if (!cctxInWorkspace) {
            ZSTD_customFree(cctx, cctx->customMem);
        }
    }
    return 0;
}